

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal.h
# Opt level: O0

uint get_quant_level(quant_method method)

{
  quant_method method_local;
  uint local_4;
  
  switch(method) {
  case QUANT_2:
    local_4 = 2;
    break;
  case QUANT_3:
    local_4 = 3;
    break;
  case QUANT_4:
    local_4 = 4;
    break;
  case QUANT_5:
    local_4 = 5;
    break;
  case QUANT_6:
    local_4 = 6;
    break;
  case QUANT_8:
    local_4 = 8;
    break;
  case QUANT_10:
    local_4 = 10;
    break;
  case QUANT_12:
    local_4 = 0xc;
    break;
  case QUANT_16:
    local_4 = 0x10;
    break;
  case QUANT_20:
    local_4 = 0x14;
    break;
  case QUANT_24:
    local_4 = 0x18;
    break;
  case QUANT_32:
    local_4 = 0x20;
    break;
  case QUANT_40:
    local_4 = 0x28;
    break;
  case QUANT_48:
    local_4 = 0x30;
    break;
  case QUANT_64:
    local_4 = 0x40;
    break;
  case QUANT_80:
    local_4 = 0x50;
    break;
  case QUANT_96:
    local_4 = 0x60;
    break;
  case QUANT_128:
    local_4 = 0x80;
    break;
  case QUANT_160:
    local_4 = 0xa0;
    break;
  case QUANT_192:
    local_4 = 0xc0;
    break;
  case QUANT_256:
    local_4 = 0x100;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline unsigned int get_quant_level(quant_method method)
{
	switch (method)
	{
	case QUANT_2:   return   2;
	case QUANT_3:   return   3;
	case QUANT_4:   return   4;
	case QUANT_5:   return   5;
	case QUANT_6:   return   6;
	case QUANT_8:   return   8;
	case QUANT_10:  return  10;
	case QUANT_12:  return  12;
	case QUANT_16:  return  16;
	case QUANT_20:  return  20;
	case QUANT_24:  return  24;
	case QUANT_32:  return  32;
	case QUANT_40:  return  40;
	case QUANT_48:  return  48;
	case QUANT_64:  return  64;
	case QUANT_80:  return  80;
	case QUANT_96:  return  96;
	case QUANT_128: return 128;
	case QUANT_160: return 160;
	case QUANT_192: return 192;
	case QUANT_256: return 256;
	}

	// Unreachable - the enum is fully described
	return 0;
}